

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkUifNodePairs(Wlc_Ntk_t *p,Vec_Int_t *vPairsInit)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int nSize;
  int FillEven;
  int iVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *vFanins;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  Wlc_Ntk_t *pWVar7;
  undefined8 in_RCX;
  uint i;
  int local_5c;
  
  p_01 = vPairsInit;
  if (vPairsInit == (Vec_Int_t *)0x0) {
    p_01 = Wlc_NtkFindUifableMultiplierPairs(p);
    if (p_01 == (Vec_Int_t *)0x0) {
      return (Wlc_Ntk_t *)0x0;
    }
  }
  if ((p_01->nSize < 1) || ((p_01->nSize & 1U) != 0)) {
    __assert_fail("Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                  ,0xfa,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  p_02 = Vec_IntAlloc(100);
  p_03 = Vec_IntAlloc(100);
  vFanins = Vec_IntAlloc(100);
  for (i = 0; (int)(i | 1) < p_01->nSize; i = i + 2) {
    iVar1 = Vec_IntEntry(p_01,i);
    iVar2 = Vec_IntEntry(p_01,i | 1);
    pWVar5 = Wlc_NtkObj(p,iVar1);
    pWVar6 = Wlc_NtkObj(p,iVar2);
    iVar3 = Wlc_NtkPairIsUifable(p,pWVar5,pWVar6);
    if (iVar3 == 0) {
      __assert_fail("Wlc_NtkPairIsUifable(p, pObj, pObj2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                    ,0x104,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
    }
    p_03->nSize = 0;
    for (iVar3 = 0; iVar4 = (int)in_RCX, iVar3 < (int)pWVar5->nFanins; iVar3 = iVar3 + 1) {
      nSize = Wlc_ObjFaninId(pWVar5,iVar3);
      FillEven = Wlc_ObjFaninId(pWVar6,iVar3);
      Vec_IntFillTwo(p_02,nSize,FillEven,iVar4);
      in_RCX = 0;
      iVar4 = Wlc_ObjCreate(p,0x20,0,0,0,p_02);
      Vec_IntPush(p_03,iVar4);
      pWVar5 = Wlc_NtkObj(p,iVar1);
    }
    iVar3 = Wlc_ObjCreate(p,0x17,0,p_03->nSize + -1,0,p_03);
    Vec_IntFill(p_02,1,iVar3);
    iVar4 = 0;
    iVar3 = Wlc_ObjCreate(p,0x26,0,0,0,p_02);
    Vec_IntFillTwo(p_02,iVar1,iVar2,iVar4);
    iVar2 = 0;
    iVar1 = Wlc_ObjCreate(p,0x1f,0,0,0,p_02);
    Vec_IntFillTwo(p_02,iVar3,iVar1,iVar2);
    in_RCX = 0;
    iVar1 = Wlc_ObjCreate(p,0x1d,0,0,0,p_02);
    Vec_IntPush(vFanins,iVar1);
  }
  iVar1 = vFanins->nSize;
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vUifConstrs) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                  ,0x120,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  if (iVar1 == 1) {
    local_5c = Vec_IntEntry(vFanins,0);
  }
  else {
    iVar1 = Wlc_ObjCreate(p,0x17,0,iVar1 + -1,0,vFanins);
    Vec_IntFill(p_02,1,iVar1);
    local_5c = Wlc_ObjCreate(p,0x25,0,0,0,p_02);
  }
  p_00 = &p->vPos;
  iVar1 = 0;
  while( true ) {
    if ((p->vPos).nSize <= iVar1) {
      Vec_IntFree(vFanins);
      Vec_IntFree(p_03);
      Vec_IntFree(p_02);
      if (p_01 != vPairsInit) {
        Vec_IntFree(p_01);
      }
      pWVar7 = Wlc_NtkDupDfs(p,0,1);
      return pWVar7;
    }
    iVar2 = Vec_IntEntry(p_00,iVar1);
    pWVar5 = Wlc_NtkObj(p,iVar2);
    iVar3 = (int)(((long)pWVar5 - (long)p->pObjs) / 0x18);
    Vec_IntFillTwo(p_02,iVar3,local_5c,0x18);
    local_5c = Wlc_ObjCreate(p,0x1c,0,0,0,p_02);
    pWVar5 = Wlc_NtkObj(p,iVar3);
    iVar2 = Vec_IntEntry(p_00,iVar1);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntEntry(&p->vPos, i) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                    ,0x135,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
    }
    iVar2 = Vec_IntEntry(&p->vCos,iVar1);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntEntry(&p->vCos, i) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                    ,0x136,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
    }
    Vec_IntWriteEntry(p_00,iVar1,local_5c);
    Vec_IntWriteEntry(&p->vCos,iVar1,local_5c);
    pWVar6 = Wlc_NtkObj(p,local_5c);
    pWVar6->field_0x1 = pWVar6->field_0x1 | 2;
    if ((*(uint *)pWVar5 >> 9 & 1) == 0) break;
    *(ushort *)pWVar5 = (ushort)*(uint *)pWVar5 & 0xfdff;
    iVar1 = iVar1 + 1;
  }
  __assert_fail("pObj->fIsPo",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                ,0x13b,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
}

Assistant:

Wlc_Ntk_t * Wlc_NtkUifNodePairs( Wlc_Ntk_t * p, Vec_Int_t * vPairsInit )
{
    Vec_Int_t * vPairs = vPairsInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObj2;
    Vec_Int_t * vUifConstrs, * vCompares, * vFanins;
    int i, k, iObj, iObj2, iObjNew, iObjNew2;
    int iFanin, iFanin2, iFaninNew;
    // get multiplier pairs if not given
    if ( vPairs == NULL )
        vPairs = Wlc_NtkFindUifableMultiplierPairs( p );
    if ( vPairs == NULL )
        return NULL;
    // sanity checks
    assert( Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0 );
    // iterate through node pairs
    vFanins = Vec_IntAlloc( 100 );
    vCompares = Vec_IntAlloc( 100 );
    vUifConstrs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, iObj2, i )
    {
        // get two nodes
        pObj  = Wlc_NtkObj( p, iObj );
        pObj2 = Wlc_NtkObj( p, iObj2 );
        assert( Wlc_NtkPairIsUifable(p, pObj, pObj2) );
        // create fanin comparator nodes
        Vec_IntClear( vCompares );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            iFanin2 = Wlc_ObjFaninId( pObj2, k );
            Vec_IntFillTwo( vFanins, 2, iFanin, iFanin2 );
            iFaninNew = Wlc_ObjCreate( p, WLC_OBJ_COMP_NOTEQU, 0, 0, 0, vFanins );
            Vec_IntPush( vCompares, iFaninNew );
            // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
            // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
            pObj = Wlc_NtkObj( p, iObj );
        }
        // concatenate fanin comparators
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vCompares) - 1, 0, vCompares );
        // create reduction-OR node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_OR, 0, 0, 0, vFanins );
        // craete output comparator node
        Vec_IntFillTwo( vFanins, 2, iObj, iObj2 );
        iObjNew2 = Wlc_ObjCreate( p, WLC_OBJ_COMP_EQU, 0, 0, 0, vFanins );
        // create implication node (iObjNew is already complemented above)
        Vec_IntFillTwo( vFanins, 2, iObjNew, iObjNew2 );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_OR, 0, 0, 0, vFanins );
        // save the constraint
        Vec_IntPush( vUifConstrs, iObjNew );
    }
    // derive the AND of the UIF contraints
    assert( Vec_IntSize(vUifConstrs) > 0 );
    if ( Vec_IntSize(vUifConstrs) == 1 )
        iObjNew = Vec_IntEntry( vUifConstrs, 0 );
    else
    {
        // concatenate
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vUifConstrs) - 1, 0, vUifConstrs );
        // create reduction-AND node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_AND, 0, 0, 0, vFanins );
    }
    // update each PO to point to the new node
    Wlc_NtkForEachPo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Vec_IntFillTwo( vFanins, 2, iObj, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_AND, 0, 0, 0, vFanins );
        // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
        // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
        pObj = Wlc_NtkObj( p, iObj );
        // update PO/CO arrays
        assert( Vec_IntEntry(&p->vPos, i) == iObj );
        assert( Vec_IntEntry(&p->vCos, i) == iObj );
        Vec_IntWriteEntry( &p->vPos, i, iObjNew );
        Vec_IntWriteEntry( &p->vCos, i, iObjNew );
        // transfer the PO attribute
        Wlc_NtkObj(p, iObjNew)->fIsPo = 1;
        assert( pObj->fIsPo );
        pObj->fIsPo = 0;
    }
    // cleanup
    Vec_IntFree( vUifConstrs );
    Vec_IntFree( vCompares );
    Vec_IntFree( vFanins );
    if ( vPairs != vPairsInit )
        Vec_IntFree( vPairs );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}